

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

void __thiscall
duckdb::CSVReaderOptions::FromNamedParameters
          (CSVReaderOptions *this,named_parameter_map_t *in,ClientContext *context,
          MultiFileOptions *file_options)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  string loption;
  string local_78;
  MultiFileReader local_58;
  
  for (p_Var1 = (in->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    StringUtil::Lower(&local_78,(string *)(p_Var1 + 1));
    local_58.function_name._M_dataplus._M_p = (pointer)&local_58.function_name.field_2;
    local_58.function_name.field_2._M_allocated_capacity = 0;
    local_58.function_name.field_2._8_8_ = 0;
    local_58._vptr_MultiFileReader = (_func_int **)&PTR__MultiFileReader_0245d0a8;
    local_58.function_name._M_string_length = 0;
    bVar2 = MultiFileReader::ParseOption
                      (&local_58,&local_78,(Value *)(p_Var1 + 5),file_options,context);
    MultiFileReader::~MultiFileReader(&local_58);
    if (!bVar2) {
      ParseOption(this,context,(string *)(p_Var1 + 1),(Value *)(p_Var1 + 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void CSVReaderOptions::FromNamedParameters(const named_parameter_map_t &in, ClientContext &context,
                                           MultiFileOptions &file_options) {
	for (auto &kv : in) {
		auto loption = StringUtil::Lower(kv.first);
		if (MultiFileReader().ParseOption(loption, kv.second, file_options, context)) {
			continue;
		}
		ParseOption(context, kv.first, kv.second);
	}
}